

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.cpp
# Opt level: O2

void vkt::SpirVAssembly::addTessCtrlTest
               (TestCaseGroup *group,char *name,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *fragments)

{
  long lVar1;
  string *in_stack_fffffffffffffca8;
  allocator<char> local_350;
  allocator<char> local_34f;
  allocator<char> local_34e;
  allocator<char> local_34d;
  allocator<char> local_34c;
  allocator<char> local_34b;
  allocator<char> local_34a;
  allocator<char> local_349;
  string local_348;
  string local_328;
  string local_308;
  undefined1 local_2e8 [32];
  _Base_ptr local_2c8;
  size_t local_2c0;
  string local_2b8;
  string local_298;
  undefined1 local_278 [16];
  string local_268;
  string local_248;
  ShaderElement pipelineStages [4];
  InstanceContext local_100;
  
  local_278._0_8_ = (pointer)0xff0000ffffffffff;
  local_278._8_8_ = 0xffff0000ff00ff00;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2e8,"vert",&local_349);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"main",&local_34a);
  ShaderElement::ShaderElement
            (pipelineStages,(string *)local_2e8,&local_328,VK_SHADER_STAGE_VERTEX_BIT);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"tessc",&local_34b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"main",&local_34c);
  ShaderElement::ShaderElement
            (pipelineStages + 1,&local_348,&local_308,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"tesse",&local_34d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"main",&local_34e);
  ShaderElement::ShaderElement
            (pipelineStages + 2,&local_298,&local_2b8,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_278 + 0x30),"frag",&local_34f)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_278 + 0x10),"main",&local_350)
  ;
  ShaderElement::ShaderElement
            (pipelineStages + 3,(string *)(local_278 + 0x30),(string *)(local_278 + 0x10),
             VK_SHADER_STAGE_FRAGMENT_BIT);
  std::__cxx11::string::~string((string *)(local_278 + 0x10));
  std::__cxx11::string::~string((string *)(local_278 + 0x30));
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)local_2e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,name,(allocator<char> *)&local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"",(allocator<char> *)&local_2b8);
  local_2e8._24_8_ = local_2e8 + 8;
  local_2e8._0_8_ = (pointer)0x0;
  local_2e8._8_8_ = 0;
  local_2e8._16_8_ = 0;
  local_2c0 = 0;
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  local_308._M_string_length = 0;
  local_308.field_2._M_local_buf[0] = '\0';
  local_2c8 = (_Base_ptr)local_2e8._24_8_;
  createInstanceContext<4ul>
            (&local_100,(SpirVAssembly *)pipelineStages,(ShaderElement (*) [4])local_278,
             (RGBA (*) [4])local_278,(RGBA (*) [4])fragments,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_2e8,(StageToSpecConstantMap *)0x1,(qpTestResult)&local_308,
             in_stack_fffffffffffffca8);
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            (group,&local_328,&local_348,addShaderCodeCustomTessControl,runAndVerifyDefaultPipeline,
             &local_100);
  InstanceContext::~InstanceContext(&local_100);
  std::__cxx11::string::~string((string *)&local_308);
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)local_2e8);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_328);
  lVar1 = 0xd8;
  do {
    ShaderElement::~ShaderElement
              ((ShaderElement *)((long)&pipelineStages[0].moduleName._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x48;
  } while (lVar1 != -0x48);
  return;
}

Assistant:

void addTessCtrlTest(tcu::TestCaseGroup* group, const char* name, const map<string, string>& fragments)
{
	RGBA defaultColors[4];
	getDefaultColors(defaultColors);
	const ShaderElement pipelineStages[] =
	{
		ShaderElement("vert", "main", VK_SHADER_STAGE_VERTEX_BIT),
		ShaderElement("tessc", "main", VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT),
		ShaderElement("tesse", "main", VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT),
		ShaderElement("frag", "main", VK_SHADER_STAGE_FRAGMENT_BIT),
	};

	addFunctionCaseWithPrograms<InstanceContext>(group, name, "", addShaderCodeCustomTessControl,
												 runAndVerifyDefaultPipeline, createInstanceContext(
													 pipelineStages, defaultColors, defaultColors, fragments, StageToSpecConstantMap()));
}